

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

int allow_postencode_drop_rtc(AV1_COMP *cpi)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = is_one_pass_rt_params(cpi);
  uVar2 = 0;
  uVar3 = 0;
  if ((((iVar1 != 0) && ((cpi->oxcf).rc_cfg.mode == AOM_CBR)) &&
      (uVar3 = uVar2, 0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark)) &&
     (((cpi->rc).rtc_external_ratectrl == 0 &&
      (((cpi->common).current_frame.frame_type & 0xfd) != 0)))) {
    uVar3 = (uint)((cpi->svc).spatial_layer_id == 0);
  }
  return uVar3;
}

Assistant:

static inline int allow_postencode_drop_rtc(const AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  return is_one_pass_rt_params(cpi) && cpi->oxcf.rc_cfg.mode == AOM_CBR &&
         cpi->oxcf.rc_cfg.drop_frames_water_mark > 0 &&
         !cpi->rc.rtc_external_ratectrl && !frame_is_intra_only(cm) &&
         cpi->svc.spatial_layer_id == 0;
}